

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadAssign(Psr_Man_t *p)

{
  Vec_Int_t *p_00;
  char cVar1;
  char cVar2;
  char cVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int Value;
  ulong uVar11;
  char *pError;
  uint ModName;
  bool bVar12;
  undefined4 uVar13;
  
  iVar8 = Psr_ManReadSignal(p);
  if (iVar8 == 0) {
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Cannot read output in assign-statement.",0x28);
      return 0;
    }
  }
  else if (*p->pCur == '=') {
    pbVar10 = (byte *)(p->pCur + 1);
    p->pCur = (char *)pbVar10;
    pbVar4 = (byte *)p->pLimit;
    while (pbVar10 < pbVar4) {
      while( true ) {
        uVar11 = (ulong)*pbVar10;
        if (0x2f < uVar11) goto LAB_00334aab;
        if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
        pbVar10 = pbVar10 + 1;
        p->pCur = (char *)pbVar10;
      }
      if (uVar11 != 0x2f) {
        if (uVar11 != 0) {
LAB_00334aab:
          cVar1 = *p->pCur;
          if (cVar1 == '~') {
            p->pCur = p->pCur + 1;
          }
          bVar12 = cVar1 == '~';
          iVar9 = Psr_ManReadSignal(p);
          if (iVar9 == 0) {
            if (p->ErrorStr[0] == '\0') {
              builtin_strncpy(p->ErrorStr,"Cannot read first input name in the assign-statement.",
                              0x36);
              return 0;
            }
            goto LAB_00334f04;
          }
          p_00 = &p->vTemp;
          (p->vTemp).nSize = 0;
          Vec_IntPush(p_00,0);
          Vec_IntPush(p_00,iVar9);
          cVar2 = *p->pCur;
          if (cVar2 == ';') {
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,iVar8);
            ModName = cVar1 != '~' ^ 0xb;
            goto LAB_00334b30;
          }
          if (cVar2 == '&') {
            ModName = 0xc;
            bVar5 = false;
LAB_00334ba5:
            bVar6 = false;
LAB_00334ba7:
            bVar7 = false;
          }
          else {
            if (cVar2 == '?') {
              ModName = 0x14;
              bVar5 = true;
              goto LAB_00334ba5;
            }
            if (cVar2 != '^') {
              if (cVar2 == '|') {
                ModName = 0xe;
                bVar6 = true;
                bVar5 = false;
                goto LAB_00334ba7;
              }
              pError = "Unrecognized operator in the assign-statement.";
              iVar8 = extraout_EDX;
              goto LAB_00334ee7;
            }
            ModName = 0x10;
            bVar7 = true;
            bVar5 = false;
            bVar6 = false;
          }
          pbVar10 = (byte *)(p->pCur + 1);
          p->pCur = (char *)pbVar10;
          pbVar4 = (byte *)p->pLimit;
          goto LAB_00334bb5;
        }
        break;
      }
      if (pbVar10[1] != 0x2a) {
        if (pbVar10[1] == 0x2f) {
          pbVar10 = pbVar10 + 2;
          p->pCur = (char *)pbVar10;
          if (pbVar10 < pbVar4) {
            while (*pbVar10 != 10) {
              pbVar10 = pbVar10 + 1;
              p->pCur = (char *)pbVar10;
              if (pbVar10 == pbVar4) goto LAB_00334aab;
            }
            pbVar10 = pbVar10 + 1;
            goto LAB_003349d0;
          }
        }
        goto LAB_00334aab;
      }
      pbVar10 = pbVar10 + 2;
      p->pCur = (char *)pbVar10;
      if (pbVar4 <= pbVar10) goto LAB_00334aab;
      while ((*pbVar10 != 0x2a || (pbVar10[1] != 0x2f))) {
        pbVar10 = pbVar10 + 1;
        p->pCur = (char *)pbVar10;
        if (pbVar10 == pbVar4) goto LAB_00334aab;
      }
      pbVar10 = pbVar10 + 2;
LAB_003349d0:
      p->pCur = (char *)pbVar10;
    }
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar13._0_1_ = ' ';
        uVar13._1_1_ = '2';
        uVar13._2_1_ = '3';
        uVar13._3_1_ = '.';
        goto LAB_00334a9f;
      }
    }
  }
  else if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Expecting \"=\" in assign-statement.",0x23);
    return 0;
  }
  goto LAB_00334f04;
LAB_00334bb5:
  if (pbVar4 <= pbVar10) goto LAB_00334cae;
  while( true ) {
    uVar11 = (ulong)*pbVar10;
    if (0x2f < uVar11) goto LAB_00334cfd;
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
    pbVar10 = pbVar10 + 1;
    p->pCur = (char *)pbVar10;
  }
  if (uVar11 != 0x2f) {
    if (uVar11 != 0) {
LAB_00334cfd:
      cVar3 = *p->pCur;
      if (cVar3 == '~') {
        p->pCur = p->pCur + 1;
      }
      iVar9 = Psr_ManReadSignal(p);
      if (iVar9 == 0) {
        pError = "Cannot read second input name in the assign-statement.";
        iVar8 = extraout_EDX_00;
        goto LAB_00334ee7;
      }
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,iVar9);
      if (bVar5) {
        if (cVar1 == '~') {
          __assert_fail("fCompl == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                        ,0x241,"int Psr_ManReadAssign(Psr_Man_t *)");
        }
        if (*p->pCur != ':') {
          pError = "Expected colon in the MUX assignment.";
          iVar8 = extraout_EDX_01;
          goto LAB_00334ee7;
        }
        p->pCur = p->pCur + 1;
        iVar9 = Psr_ManReadSignal(p);
        if (iVar9 == 0) {
          pError = "Cannot read third input name in the assign-statement.";
          iVar8 = extraout_EDX_02;
LAB_00334ee7:
          Psr_ManErrorSet(p,pError,iVar8);
          return 0;
        }
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,iVar9);
        ModName = 0x14;
        if (*p->pCur != ';') {
          Psr_ManErrorSet(p,"Expected semicolon at the end of the assign-statement.",Value);
          return 0;
        }
      }
      else if (cVar2 == '&') {
        ModName = 0x13;
        if ((cVar1 != '~' || cVar3 == '~') && (ModName = 0x12, cVar1 == '~' || cVar3 != '~')) {
          ModName = 0xc;
          if (cVar3 == '~') {
            ModName = (uint)bVar12 * 3 + 0xc;
          }
        }
      }
      else if (bVar6) {
        ModName = 0xd;
        if ((!bVar12 || cVar3 != '~') && (ModName = 0xe, cVar3 == '~' || bVar12)) {
          __assert_fail("!fCompl && !fCompl2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                        ,0x25b,"int Psr_ManReadAssign(Psr_Man_t *)");
        }
      }
      else if (((bVar7) && (ModName = 0x11, cVar1 != '~' || cVar3 == '~')) &&
              (ModName = 0x10, cVar3 == '~' || bVar12)) {
        __assert_fail("!fCompl && !fCompl2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                      ,0x261,"int Psr_ManReadAssign(Psr_Man_t *)");
      }
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,iVar8);
LAB_00334b30:
      Psr_NtkAddBox(p->pNtk,ModName,0,p_00);
      return 1;
    }
    goto LAB_00334cae;
  }
  if (pbVar10[1] != 0x2a) {
    if (pbVar10[1] == 0x2f) {
      pbVar10 = pbVar10 + 2;
      p->pCur = (char *)pbVar10;
      if (pbVar10 < pbVar4) {
        while (*pbVar10 != 10) {
          pbVar10 = pbVar10 + 1;
          p->pCur = (char *)pbVar10;
          if (pbVar10 == pbVar4) goto LAB_00334cfd;
        }
        pbVar10 = pbVar10 + 1;
        goto LAB_00334c53;
      }
    }
    goto LAB_00334cfd;
  }
  pbVar10 = pbVar10 + 2;
  p->pCur = (char *)pbVar10;
  if (pbVar4 <= pbVar10) goto LAB_00334cfd;
  while ((*pbVar10 != 0x2a || (pbVar10[1] != 0x2f))) {
    pbVar10 = pbVar10 + 1;
    p->pCur = (char *)pbVar10;
    if (pbVar10 == pbVar4) goto LAB_00334cfd;
  }
  pbVar10 = pbVar10 + 2;
LAB_00334c53:
  p->pCur = (char *)pbVar10;
  goto LAB_00334bb5;
LAB_00334cae:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar13._0_1_ = ' ';
      uVar13._1_1_ = '2';
      uVar13._2_1_ = '4';
      uVar13._3_1_ = '.';
LAB_00334a9f:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar13;
      p->ErrorStr[0x10] = '\0';
      return 0;
    }
  }
LAB_00334f04:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrs.h"
                ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
}

Assistant:

static inline int Psr_ManReadAssign( Psr_Man_t * p )
{
    int OutItem, InItem, fCompl = 0, fCompl2 = 0, Oper = 0;
    // read output name
    OutItem = Psr_ManReadSignal( p );
    if ( OutItem == 0 )                     return Psr_ManErrorSet(p, "Cannot read output in assign-statement.", 0);
    if ( !Psr_ManIsChar(p, '=') )           return Psr_ManErrorSet(p, "Expecting \"=\" in assign-statement.", 0);
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 23.", 0);
    if ( Psr_ManIsChar(p, '~') ) 
    { 
        fCompl = 1; 
        p->pCur++; 
    }
    // read first name
    InItem = Psr_ManReadSignal( p );
    if ( InItem == 0 )                      return Psr_ManErrorSet(p, "Cannot read first input name in the assign-statement.", 0);
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, InItem );
    // check unary operator
    if ( Psr_ManIsChar(p, ';') )
    {
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, OutItem );
        Oper = fCompl ? BAC_BOX_INV : BAC_BOX_BUF;
        Psr_NtkAddBox( p->pNtk, Oper, 0, &p->vTemp );
        return 1;
    }
    if ( Psr_ManIsChar(p, '&') ) 
        Oper = BAC_BOX_AND;
    else if ( Psr_ManIsChar(p, '|') ) 
        Oper = BAC_BOX_OR;
    else if ( Psr_ManIsChar(p, '^') ) 
        Oper = BAC_BOX_XOR;
    else if ( Psr_ManIsChar(p, '?') ) 
        Oper = BAC_BOX_MUX;
    else                                    return Psr_ManErrorSet(p, "Unrecognized operator in the assign-statement.", 0);
    p->pCur++; 
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 24.", 0);
    if ( Psr_ManIsChar(p, '~') ) 
    { 
        fCompl2 = 1; 
        p->pCur++; 
    }
    // read second name
    InItem = Psr_ManReadSignal( p );
    if ( InItem == 0 )                      return Psr_ManErrorSet(p, "Cannot read second input name in the assign-statement.", 0);
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, InItem );
    // read third argument
    if ( Oper == BAC_BOX_MUX )
    {
        assert( fCompl == 0 ); 
        if ( !Psr_ManIsChar(p, ':') )       return Psr_ManErrorSet(p, "Expected colon in the MUX assignment.", 0);
        p->pCur++; 
        // read third name
        InItem = Psr_ManReadSignal( p );
        if ( InItem == 0 )                  return Psr_ManErrorSet(p, "Cannot read third input name in the assign-statement.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, InItem );
        if ( !Psr_ManIsChar(p, ';') )       return Psr_ManErrorSet(p, "Expected semicolon at the end of the assign-statement.", 0);
    }
    else
    {
        // figure out operator
        if ( Oper == BAC_BOX_AND )
        {
            if ( fCompl && !fCompl2 )
                Oper = BAC_BOX_SHARPL;
            else if ( !fCompl && fCompl2 )
                Oper = BAC_BOX_SHARP;
            else if ( fCompl && fCompl2 )
                Oper = BAC_BOX_NOR;
        }
        else if ( Oper == BAC_BOX_OR )
        {
            if ( fCompl && fCompl2 )
                Oper = BAC_BOX_NAND;
            else assert( !fCompl && !fCompl2 );
        }
        else if ( Oper == BAC_BOX_XOR )
        {
            if ( fCompl && !fCompl2 )
                Oper = BAC_BOX_XNOR;
            else assert( !fCompl && !fCompl2 );
        }
    }
    // write binary operator
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    Psr_NtkAddBox( p->pNtk, Oper, 0, &p->vTemp );
    return 1;
}